

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O1

TestStatus *
vkt::clipping::anon_unknown_0::ClipDistanceComplementarity::testComplementarity
          (TestStatus *__return_storage_ptr__,Context *context,int numClipDistances)

{
  ostringstream *this;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var1;
  ProgramBinary *pPVar2;
  TestStatus *pTVar3;
  Context *context_00;
  int iVar4;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  const_iterator cVar5;
  TestLog *pTVar6;
  ulong uVar7;
  int i_1;
  int i;
  long lVar8;
  float *pfVar9;
  float fVar10;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  Vec4 p3;
  Vec4 p2;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  Vec4 p0;
  VulkanDrawContext drawContext;
  DrawState drawState;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> local_5f8;
  void *local_5d8;
  int local_5d0;
  float local_5cc;
  value_type local_5c8;
  value_type local_5b8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_5a8;
  TestStatus *local_588;
  Context *local_580;
  float *local_578;
  ulong local_570;
  undefined1 local_568 [16];
  int local_558;
  undefined8 local_554;
  int local_54c;
  void *local_548;
  VulkanProgram local_540;
  DrawCallData local_538;
  IVec2 local_530;
  IVec2 local_528;
  undefined1 local_520 [4];
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  int local_510;
  int iStack_50c;
  int iStack_508;
  int local_504;
  void *local_500;
  ios_base local_4a8 [264];
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390 [6];
  ios_base local_328 [376];
  undefined1 local_1b0 [4];
  float fStack_1ac;
  float fStack_1a8;
  float local_1a4;
  bool local_19f;
  ios_base local_138 [264];
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,0x200);
  local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Shader *)0x0;
  local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Shader *)0x0;
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_3a0._0_8_ = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"vert","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)local_3a0);
  pPVar2 = *(ProgramBinary **)(cVar5._M_node + 2);
  local_520 = (undefined1  [4])0x1;
  fStack_518 = SUB84(pPVar2,0);
  fStack_514 = (float)((ulong)pPVar2 >> 0x20);
  if (local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
    _M_realloc_insert<vkt::drawutil::Shader>
              (&local_5f8,
               (iterator)
               local_5f8.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish,(Shader *)local_520);
  }
  else {
    *(ulong *)local_5f8.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_finish = CONCAT44(fStack_51c,1);
    (local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->binary = pPVar2;
    local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._0_8_ != local_390) {
    operator_delete((void *)local_3a0._0_8_,local_390[0]._M_allocated_capacity + 1);
  }
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_3a0._0_8_ = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"frag","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)local_3a0);
  pPVar2 = *(ProgramBinary **)(cVar5._M_node + 2);
  local_520 = (undefined1  [4])0x10;
  fStack_518 = SUB84(pPVar2,0);
  fStack_514 = (float)((ulong)pPVar2 >> 0x20);
  if (local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
    _M_realloc_insert<vkt::drawutil::Shader>
              (&local_5f8,
               (iterator)
               local_5f8.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish,(Shader *)local_520);
  }
  else {
    *(ulong *)local_5f8.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_finish = CONCAT44(fStack_51c,0x10);
    (local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->binary = pPVar2;
    local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._0_8_ != local_390) {
    operator_delete((void *)local_3a0._0_8_,local_390[0]._M_allocated_capacity + 1);
  }
  local_5a8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5a8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init((deRandom *)local_3a0,0x4d2);
  local_5d8 = operator_new(0x100);
  lVar8 = 0;
  local_580 = context;
  memset(local_5d8,0,0x100);
  do {
    fVar10 = deRandom_getFloat((deRandom *)local_3a0);
    *(float *)((long)local_5d8 + lVar8 * 4) = fVar10 + fVar10 + -1.0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x40);
  local_578 = (float *)((long)local_5d8 + 0xc);
  uVar7 = 0;
  local_5d0 = numClipDistances;
  local_588 = __return_storage_ptr__;
  do {
    local_5cc = *(float *)(&DAT_00af6840 + (ulong)((int)uVar7 == 0) * 4);
    lVar8 = 0;
    pfVar9 = local_578;
    local_570 = uVar7;
    do {
      local_520 = (undefined1  [4])((float)(int)lVar8 * 0.125 + -1.0);
      fStack_514 = pfVar9[-3] * local_5cc;
      fStack_51c = -1.0;
      fStack_518 = 0.0;
      local_1a4 = pfVar9[-2] * local_5cc;
      fStack_1ac = 1.0;
      fStack_1a8 = 0.0;
      local_5c8.m_data[0] = (float)local_520 + 0.125;
      local_5b8.m_data[3] = pfVar9[-1] * local_5cc;
      local_5b8.m_data[1] = 1.0;
      local_5b8.m_data[2] = 0.0;
      local_5c8.m_data[3] = *pfVar9 * local_5cc;
      local_5c8.m_data[1] = -1.0;
      local_5c8.m_data[2] = 0.0;
      local_5b8.m_data[0] = local_5c8.m_data[0];
      local_1b0 = local_520;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&local_5a8,(value_type *)local_520);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&local_5a8,(value_type *)local_1b0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&local_5a8,&local_5b8);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&local_5a8,&local_5b8);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&local_5a8,&local_5c8);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&local_5a8,(value_type *)local_520);
      lVar8 = lVar8 + 1;
      pfVar9 = pfVar9 + 4;
    } while (lVar8 != 0x10);
    uVar7 = (ulong)((int)local_570 + 1);
  } while ((int)local_570 == 0);
  operator_delete(local_5d8,0x100);
  context_00 = local_580;
  pTVar6 = local_580->m_testCtx->m_log;
  local_1b0 = SUB84(pTVar6,0);
  fStack_1ac = (float)((ulong)pTVar6 >> 0x20);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&fStack_1a8,
             "Draw two sets of primitives with blending, differing only with ClipDistance sign.",
             0x51);
  pTVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_520 = SUB84(pTVar6,0);
  fStack_51c = (float)((ulong)pTVar6 >> 0x20);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_518);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_518,"Using ",6);
  std::ostream::operator<<((ostringstream *)&fStack_518,local_5d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&fStack_518,
             " clipping plane(s), one of them possibly having negative values.",0x40);
  local_3a0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_520,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this = (ostringstream *)(local_3a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,
             "Expecting a uniform gray area, no missing (black) nor overlapped (white) pixels.",0x50
            );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_328);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_518);
  std::ios_base::~ios_base(local_4a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1a8);
  std::ios_base::~ios_base(local_138);
  drawutil::DrawState::DrawState
            ((DrawState *)local_1b0,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0x80,0x80);
  local_19f = true;
  local_540.shaders = &local_5f8;
  local_538.vertices = &local_5a8;
  drawutil::VulkanDrawContext::VulkanDrawContext
            ((VulkanDrawContext *)local_3a0,context_00,(DrawState *)local_1b0,&local_538,&local_540)
  ;
  pTVar3 = local_588;
  drawutil::VulkanDrawContext::draw((VulkanDrawContext *)local_3a0);
  drawutil::VulkanDrawContext::getColorPixels
            ((ConstPixelBufferAccess *)local_568,(VulkanDrawContext *)local_3a0);
  local_5b8.m_data[0] = 0.5;
  local_5b8.m_data[1] = 0.5;
  local_5b8.m_data[2] = 0.5;
  local_5b8.m_data[3] = 1.0;
  local_5c8.m_data[0] = 0.02;
  local_5c8.m_data[1] = 0.02;
  local_5c8.m_data[2] = 0.02;
  local_5c8.m_data[3] = 0.0;
  local_520 = SUB84(local_568._0_8_,0);
  fStack_51c = SUB84(local_568._0_8_,4);
  fStack_518 = (float)local_568._8_8_;
  fStack_514 = SUB84(local_568._8_8_,4);
  local_510 = local_558;
  iStack_50c = (int)local_554;
  iStack_508 = SUB84(local_554,4);
  local_504 = local_54c;
  local_500 = local_548;
  local_530.m_data[0] = 0;
  local_530.m_data[1] = 0;
  local_528.m_data[0] = local_568._8_4_;
  local_528.m_data[1] = local_568._12_4_;
  iVar4 = countPixels((ConstPixelBufferAccess *)local_520,&local_530,&local_528,&local_5b8,
                      &local_5c8);
  if (iVar4 == 0x4000) {
    _local_520 = (TextureFormat)&local_510;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"OK","");
    pTVar3->m_code = QP_TEST_RESULT_PASS;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,_local_520,
               CONCAT44(fStack_514,fStack_518) + (long)_local_520);
  }
  else {
    _local_520 = (TextureFormat)&local_510;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_520,"Rendered image(s) are incorrect","");
    pTVar3->m_code = QP_TEST_RESULT_FAIL;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,_local_520,
               CONCAT44(fStack_514,fStack_518) + (long)_local_520);
  }
  if (_local_520 != (TextureFormat)&local_510) {
    operator_delete((void *)_local_520,CONCAT44(iStack_50c,local_510) + 1);
  }
  drawutil::VulkanDrawContext::~VulkanDrawContext((VulkanDrawContext *)local_3a0);
  if (local_5a8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5a8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5a8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5a8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5f8.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f8.
                    super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5f8.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f8.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus testComplementarity (Context& context, const int numClipDistances)
{
	// Check test requirements
	{
		const InstanceInterface&		vki			= context.getInstanceInterface();
		const VkPhysicalDevice			physDevice	= context.getPhysicalDevice();

		requireFeatures(vki, physDevice, FEATURE_SHADER_CLIP_DISTANCE);
	}

	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));

	std::vector<Vec4> vertices;
	{
		de::Random	rnd						(1234);
		const int	numSections				= 16;
		const int	numVerticesPerSection	= 4;	// logical verticies, due to triangle list topology we actually use 6 per section

		DE_ASSERT(RENDER_SIZE_LARGE % numSections == 0);

		std::vector<float> clipDistances(numVerticesPerSection * numSections);
		for (int i = 0; i < static_cast<int>(clipDistances.size()); ++i)
			clipDistances[i] = rnd.getFloat(-1.0f, 1.0f);

		// Two sets of identical primitives, but with a different ClipDistance sign.
		for (int setNdx = 0; setNdx < 2; ++setNdx)
		{
			const float sign = (setNdx == 0 ? 1.0f : -1.0f);
			const float	dx	 = 2.0f / static_cast<float>(numSections);

			for (int i = 0; i < numSections; ++i)
			{
				const int	ndxBase	= numVerticesPerSection * i;
				const float x		= -1.0f + dx * static_cast<float>(i);
				const Vec4	p0		= Vec4(x,      -1.0f, 0.0f, sign * clipDistances[ndxBase + 0]);
				const Vec4	p1		= Vec4(x,       1.0f, 0.0f, sign * clipDistances[ndxBase + 1]);
				const Vec4	p2		= Vec4(x + dx,  1.0f, 0.0f, sign * clipDistances[ndxBase + 2]);
				const Vec4	p3		= Vec4(x + dx, -1.0f, 0.0f, sign * clipDistances[ndxBase + 3]);

				vertices.push_back(p0);
				vertices.push_back(p1);
				vertices.push_back(p2);

				vertices.push_back(p2);
				vertices.push_back(p3);
				vertices.push_back(p0);
			}
		}
	}

	tcu::TestLog& log = context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Draw two sets of primitives with blending, differing only with ClipDistance sign." << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Using " << numClipDistances << " clipping plane(s), one of them possibly having negative values." << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Expecting a uniform gray area, no missing (black) nor overlapped (white) pixels." << tcu::TestLog::EndMessage;

	DrawState					drawState		(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, RENDER_SIZE_LARGE, RENDER_SIZE_LARGE);
	DrawCallData				drawCallData	(vertices);
	VulkanProgram				vulkanProgram	(shaders);
	drawState.blendEnable		= true;

	VulkanDrawContext			drawContext(context, drawState, drawCallData, vulkanProgram);
	drawContext.draw();

	const int numGrayPixels		= countPixels(drawContext.getColorPixels(), Vec4(0.5f, 0.5f, 0.5f, 1.0f), Vec4(0.02f, 0.02f, 0.02f, 0.0f));
	const int numExpectedPixels	= RENDER_SIZE_LARGE * RENDER_SIZE_LARGE;

	return (numGrayPixels == numExpectedPixels ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}